

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashing.h
# Opt level: O3

hash_code llvm::hashing::detail::
          hash_combine_range_impl<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     first,__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           last)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  uint64_t uVar5;
  uchar *puVar6;
  uchar *__n;
  char buffer [64];
  hash_state state;
  uchar local_a8 [64];
  hash_state local_68;
  
  if (get_execution_seed()::seed == '\0') {
    hash_combine_range_impl<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              ();
  }
  uVar5 = get_execution_seed()::seed;
  if (first._M_current == last._M_current) {
    __n = (uchar *)0x0;
  }
  else {
    puVar6 = (uchar *)0x3f;
    if (last._M_current + ~(ulong)first._M_current < (uchar *)0x3f) {
      puVar6 = last._M_current + ~(ulong)first._M_current;
    }
    __n = puVar6 + 1;
    memcpy(local_a8,first._M_current,(size_t)__n);
    puVar6 = first._M_current + (long)puVar6 + 1;
    if (puVar6 != last._M_current) {
      if (__n != (uchar *)0x40) {
        __assert_fail("buffer_ptr == buffer_end",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/Hashing.h"
                      ,0x1a0,
                      "hash_code llvm::hashing::detail::hash_combine_range_impl(InputIteratorT, InputIteratorT) [InputIteratorT = __gnu_cxx::__normal_iterator<const unsigned char *, std::vector<unsigned char>>]"
                     );
      }
      hash_state::create(&local_68,(char *)local_a8,uVar5);
      lVar2 = 0x40;
      do {
        lVar3 = lVar2;
        uVar1 = 0;
        do {
          uVar4 = uVar1;
          uVar1 = uVar4 + 1;
          local_a8[uVar4] = *puVar6;
          puVar6 = puVar6 + 1;
          if (puVar6 == last._M_current) break;
        } while (uVar4 < 0x3f);
        std::_V2::__rotate<char*>(local_a8,local_a8 + uVar4 + 1,&local_68);
        hash_state::mix(&local_68,(char *)local_a8);
        lVar2 = uVar1 + lVar3;
        if (puVar6 == last._M_current) {
          uVar5 = hash_state::finalize(&local_68,lVar3 + uVar1);
          return (hash_code)uVar5;
        }
      } while( true );
    }
  }
  uVar5 = hash_short((char *)local_a8,(size_t)__n,uVar5);
  return (hash_code)uVar5;
}

Assistant:

hash_code hash_combine_range_impl(InputIteratorT first, InputIteratorT last) {
  const uint64_t seed = get_execution_seed();
  char buffer[64], *buffer_ptr = buffer;
  char *const buffer_end = std::end(buffer);
  while (first != last && store_and_advance(buffer_ptr, buffer_end,
                                            get_hashable_data(*first)))
    ++first;
  if (first == last)
    return hash_short(buffer, buffer_ptr - buffer, seed);
  assert(buffer_ptr == buffer_end);

  hash_state state = state.create(buffer, seed);
  size_t length = 64;
  while (first != last) {
    // Fill up the buffer. We don't clear it, which re-mixes the last round
    // when only a partial 64-byte chunk is left.
    buffer_ptr = buffer;
    while (first != last && store_and_advance(buffer_ptr, buffer_end,
                                              get_hashable_data(*first)))
      ++first;

    // Rotate the buffer if we did a partial fill in order to simulate doing
    // a mix of the last 64-bytes. That is how the algorithm works when we
    // have a contiguous byte sequence, and we want to emulate that here.
    std::rotate(buffer, buffer_ptr, buffer_end);

    // Mix this chunk into the current state.
    state.mix(buffer);
    length += buffer_ptr - buffer;
  };

  return state.finalize(length);
}